

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowMetricsWindow::Funcs::NodeDrawCmdShowMeshAndBoundingBox
               (ImGuiWindow *window,ImDrawList *draw_list,ImDrawCmd *draw_cmd,int elem_offset,
               bool show_mesh,bool show_aabb)

{
  ImDrawList *this;
  uint uVar1;
  ImVec2 IVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  ImGuiContext *pIVar5;
  ImDrawVert *pIVar6;
  ulong uVar7;
  ImVec2 IVar8;
  int n;
  long lVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  float fVar14;
  float fVar16;
  undefined1 auVar15 [16];
  undefined1 in_XMM2 [16];
  undefined8 uVar20;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 local_98 [8];
  undefined8 uStack_90;
  ImVec2 triangle [3];
  ImVec2 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar5 = GImGui;
  if ((char)elem_offset != '\0' || show_mesh) {
    uVar7 = (ulong)draw_cmd & 0xffffffff;
    if ((int)(window->Pos).x < 1) {
      IVar8.x = 0.0;
      IVar8.y = 0.0;
    }
    else {
      IVar8 = window->Size;
    }
    this = &GImGui->ForegroundDrawList;
    local_58._0_4_ = (float)(draw_list->CmdBuffer).Size;
    local_58._4_4_ = (float)(draw_list->CmdBuffer).Capacity;
    uStack_50 = 0;
    local_48 = (draw_list->CmdBuffer).Data;
    uStack_40 = 0;
    uVar1 = (GImGui->ForegroundDrawList).Flags;
    (GImGui->ForegroundDrawList).Flags = uVar1 & 0xfffffffe;
    uStack_90 = 0x7f7fffff7f7fffff;
    local_98 = (undefined1  [8])0xff7fffffff7fffff;
    for (; (uint)uVar7 < (uint)((draw_list->VtxBuffer).Size + (int)draw_cmd); uVar7 = uVar7 + 3) {
      triangle[0].x = 0.0;
      triangle[0].y = 0.0;
      triangle[1].x = 0.0;
      triangle[1].y = 0.0;
      triangle[2].x = 0.0;
      triangle[2].y = 0.0;
      for (lVar9 = 0; uVar20 = in_XMM2._8_8_, lVar9 != 3; lVar9 = lVar9 + 1) {
        uVar10 = (uint)(uVar7 + lVar9);
        if (IVar8 != (ImVec2)0x0) {
          uVar10 = (uint)*(ushort *)((long)IVar8 + (uVar7 + lVar9 & 0xffffffff) * 2);
        }
        pIVar6 = ImVector<ImDrawVert>::operator[]((ImVector<ImDrawVert> *)&window->SizeFull,uVar10);
        IVar2 = pIVar6->pos;
        fVar14 = IVar2.x;
        fVar16 = IVar2.y;
        triangle[lVar9] = IVar2;
        uVar10 = -(uint)(local_98._0_4_ < fVar14);
        uVar11 = -(uint)(local_98._4_4_ < fVar16);
        auVar3._4_8_ = uVar20;
        auVar3._0_4_ = fVar16;
        auVar17._0_8_ = auVar3._0_8_ << 0x20;
        auVar17._8_4_ = fVar14;
        auVar17._12_4_ = fVar16;
        uVar12 = -(uint)(fVar14 < local_98._8_4_);
        uVar13 = -(uint)(fVar16 < local_98._12_4_);
        auVar4._4_8_ = auVar17._8_8_;
        auVar4._0_4_ = -(uint)(fVar16 < local_98._4_4_);
        auVar18._0_8_ = auVar4._0_8_ << 0x20;
        auVar18._8_4_ = uVar12;
        auVar18._12_4_ = uVar13;
        auVar15._0_4_ = (uint)fVar14 & uVar10;
        auVar15._4_4_ = (uint)fVar16 & uVar11;
        auVar15._8_4_ = (uint)fVar14 & uVar12;
        auVar15._12_4_ = (uint)fVar16 & uVar13;
        auVar19._0_8_ = ~CONCAT44(uVar11,uVar10) & local_98;
        auVar19._8_8_ = ~auVar18._8_8_ & local_98._8_8_;
        in_XMM2 = auVar19 | auVar15;
        _local_98 = in_XMM2;
      }
      if ((char)elem_offset != '\0') {
        ImDrawList::AddPolyline(this,triangle,3,0xff00ffff,true,1.0);
      }
    }
    if (show_mesh) {
      triangle[0].x = (float)(int)(float)local_58;
      triangle[0].y = (float)(int)local_58._4_4_;
      local_60.x = (float)(int)(float)local_48;
      local_60.y = (float)(int)local_48._4_4_;
      ImDrawList::AddRect(this,triangle,&local_60,0xffff00ff,0.0,0xf,1.0);
      triangle[0].x = (float)(int)(float)uStack_90;
      triangle[0].y = (float)(int)uStack_90._4_4_;
      local_60.x = (float)(int)(float)local_98._0_4_;
      local_60.y = (float)(int)(float)local_98._4_4_;
      ImDrawList::AddRect(this,triangle,&local_60,0xffffff00,0.0,0xf,1.0);
    }
    (pIVar5->ForegroundDrawList).Flags = uVar1;
    return;
  }
  __assert_fail("show_mesh || show_aabb",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kentril0[P]OpenGL_Atmospheric_Scattering/src/libs/imgui/imgui.cpp"
                ,0x2891,
                "static void ImGui::ShowMetricsWindow(bool *)::Funcs::NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow *, const ImDrawList *, const ImDrawCmd *, int, bool, bool)"
               );
}

Assistant:

static void NodeDrawCmdShowMeshAndBoundingBox(ImGuiWindow* window, const ImDrawList* draw_list, const ImDrawCmd* draw_cmd, int elem_offset, bool show_mesh, bool show_aabb)
        {
            IM_ASSERT(show_mesh || show_aabb);
            ImDrawList* fg_draw_list = GetForegroundDrawList(window); // Render additional visuals into the top-most draw list
            ImDrawIdx* idx_buffer = (draw_list->IdxBuffer.Size > 0) ? draw_list->IdxBuffer.Data : NULL;

            // Draw wire-frame version of all triangles
            ImRect clip_rect = draw_cmd->ClipRect;
            ImRect vtxs_rect(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
            ImDrawListFlags backup_flags = fg_draw_list->Flags;
            fg_draw_list->Flags &= ~ImDrawListFlags_AntiAliasedLines; // Disable AA on triangle outlines is more readable for very large and thin triangles.
            for (unsigned int base_idx = elem_offset; base_idx < (elem_offset + draw_cmd->ElemCount); base_idx += 3)
            {
                ImVec2 triangle[3];
                for (int n = 0; n < 3; n++)
                {
                    ImVec2 p = draw_list->VtxBuffer[idx_buffer ? idx_buffer[base_idx + n] : (base_idx + n)].pos;
                    triangle[n] = p;
                    vtxs_rect.Add(p);
                }
                if (show_mesh)
                    fg_draw_list->AddPolyline(triangle, 3, IM_COL32(255, 255, 0, 255), true, 1.0f); // In yellow: mesh triangles
            }
            // Draw bounding boxes
            if (show_aabb)
            {
                fg_draw_list->AddRect(ImFloor(clip_rect.Min), ImFloor(clip_rect.Max), IM_COL32(255, 0, 255, 255)); // In pink: clipping rectangle submitted to GPU
                fg_draw_list->AddRect(ImFloor(vtxs_rect.Min), ImFloor(vtxs_rect.Max), IM_COL32(0, 255, 255, 255)); // In cyan: bounding box of triangles
            }
            fg_draw_list->Flags = backup_flags;
        }